

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::benchmarkEnded
          (ConsoleReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats)

{
  uint uVar1;
  TablePrinter *pTVar2;
  rep_conflict rVar3;
  Duration local_b8;
  Duration local_a0;
  Duration local_88;
  Duration local_70;
  Duration local_58;
  Duration local_40;
  Duration local_28;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *local_18;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats_local;
  ConsoleReporter *this_local;
  
  local_18 = stats;
  stats_local = (BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)this
  ;
  uVar1 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0x15])();
  if ((uVar1 & 1) == 0) {
    pTVar2 = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
    pTVar2 = Catch::operator<<(pTVar2);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).point);
    anon_unknown_23::Duration::Duration(&local_40,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_40);
    pTVar2 = Catch::operator<<(pTVar2);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).lower_bound);
    anon_unknown_23::Duration::Duration(&local_58,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_58);
    pTVar2 = Catch::operator<<(pTVar2);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).upper_bound);
    anon_unknown_23::Duration::Duration(&local_70,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_70);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->standardDeviation).point);
    anon_unknown_23::Duration::Duration(&local_88,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_88);
    pTVar2 = Catch::operator<<(pTVar2);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->standardDeviation).lower_bound);
    anon_unknown_23::Duration::Duration(&local_a0,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_a0);
    pTVar2 = Catch::operator<<(pTVar2);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->standardDeviation).upper_bound);
    anon_unknown_23::Duration::Duration(&local_b8,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_b8);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    Catch::operator<<(pTVar2);
  }
  else {
    pTVar2 = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      (&(local_18->mean).point);
    anon_unknown_23::Duration::Duration(&local_28,rVar3,Auto);
    pTVar2 = Catch::operator<<(pTVar2,&local_28);
    Catch::operator<<(pTVar2);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats<> const &stats) {
                if (m_config->benchmarkNoAnalysis())
                {
                    (*m_tablePrinter) << Duration(stats.mean.point.count()) << ColumnBreak();
                }
                else
                {
                    (*m_tablePrinter) << ColumnBreak()
                        << Duration(stats.mean.point.count()) << ColumnBreak()
                        << Duration(stats.mean.lower_bound.count()) << ColumnBreak()
                        << Duration(stats.mean.upper_bound.count()) << ColumnBreak() << ColumnBreak()
                        << Duration(stats.standardDeviation.point.count()) << ColumnBreak()
                        << Duration(stats.standardDeviation.lower_bound.count()) << ColumnBreak()
                        << Duration(stats.standardDeviation.upper_bound.count()) << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak();
                }
            }